

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O2

int has_ext(char *ext)

{
  byte *pbVar1;
  size_t sVar2;
  byte *pbVar3;
  int iVar4;
  byte *__haystack;
  
  iVar4 = 0;
  __haystack = (byte *)exts;
  if (ext != (char *)0x0 && exts != (char *)0x0) {
    do {
      pbVar1 = (byte *)strstr((char *)__haystack,ext);
      if (pbVar1 == (byte *)0x0) {
        return 0;
      }
      sVar2 = strlen(ext);
      pbVar3 = pbVar1 + sVar2;
    } while (((pbVar1 != __haystack) && (__haystack = pbVar3, pbVar1[-1] != 0x20)) ||
            (__haystack = pbVar3, (*pbVar3 & 0xdf) != 0));
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}